

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall ipx::Model::ScaleModel(Model *this,Control *control)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  iterator __position;
  size_t sVar6;
  uint in_EAX;
  int iVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  undefined8 uStack_38;
  
  piVar4 = (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar4) {
    (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar4;
  }
  uStack_38 = (ulong)in_EAX;
  if (0 < this->num_var_) {
    iVar7 = 0;
    do {
      pdVar8 = (this->scaled_ubuser_)._M_data;
      dVar1 = pdVar8[iVar7];
      if (((ulong)ABS(dVar1) < 0x7ff0000000000000) &&
         (pdVar9 = (this->scaled_lbuser_)._M_data, ABS(pdVar9[iVar7]) == INFINITY)) {
        pdVar9[iVar7] = -dVar1;
        pdVar8[iVar7] = INFINITY;
        piVar4 = (this->A_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar2 = piVar4[iVar7];
        lVar10 = (long)iVar2;
        iVar3 = piVar4[(long)iVar7 + 1];
        if (iVar2 < iVar3) {
          pdVar5 = (this->A_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            pdVar5[lVar10] = -pdVar5[lVar10];
            lVar10 = lVar10 + 1;
          } while (iVar3 != lVar10);
        }
        pdVar8 = (this->scaled_obj_)._M_data;
        pdVar8[iVar7] = -pdVar8[iVar7];
        __position._M_current =
             (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->flipped_vars_,__position,
                     (int *)((long)&uStack_38 + 4));
        }
        else {
          *__position._M_current = iVar7;
          (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      iVar7 = uStack_38._4_4_ + 1;
      uStack_38 = CONCAT44(iVar7,(undefined4)uStack_38);
    } while (iVar7 < this->num_var_);
  }
  if ((this->colscale_)._M_size != 0) {
    operator_delete((this->colscale_)._M_data);
    (this->colscale_)._M_size = 0;
    pdVar8 = (double *)operator_new(0);
    (this->colscale_)._M_data = pdVar8;
  }
  if ((this->rowscale_)._M_size != 0) {
    operator_delete((this->rowscale_)._M_data);
    (this->rowscale_)._M_size = 0;
    pdVar8 = (double *)operator_new(0);
    (this->rowscale_)._M_data = pdVar8;
  }
  if (0 < (control->parameters_).super_ipx_parameters.scale) {
    EquilibrateMatrix(this);
  }
  if ((this->colscale_)._M_size != 0) {
    sVar6 = (this->scaled_obj_)._M_size;
    pdVar8 = (this->colscale_)._M_data;
    if (0 < (long)sVar6) {
      pdVar9 = (this->scaled_obj_)._M_data;
      pdVar11 = pdVar8;
      do {
        *pdVar9 = *pdVar11 * *pdVar9;
        pdVar9 = pdVar9 + 1;
        pdVar11 = pdVar11 + 1;
      } while (pdVar11 < pdVar8 + sVar6);
    }
    sVar6 = (this->scaled_lbuser_)._M_size;
    if (0 < (long)sVar6) {
      pdVar9 = (this->scaled_lbuser_)._M_data;
      pdVar11 = pdVar8;
      do {
        *pdVar9 = *pdVar9 / *pdVar11;
        pdVar9 = pdVar9 + 1;
        pdVar11 = pdVar11 + 1;
      } while (pdVar11 < pdVar8 + sVar6);
    }
    sVar6 = (this->scaled_ubuser_)._M_size;
    if (0 < (long)sVar6) {
      pdVar9 = pdVar8 + sVar6;
      pdVar11 = (this->scaled_ubuser_)._M_data;
      do {
        *pdVar11 = *pdVar11 / *pdVar8;
        pdVar11 = pdVar11 + 1;
        pdVar8 = pdVar8 + 1;
      } while (pdVar8 < pdVar9);
    }
  }
  if (((this->rowscale_)._M_size != 0) && (sVar6 = (this->scaled_rhs_)._M_size, 0 < (long)sVar6)) {
    pdVar9 = (this->rowscale_)._M_data;
    pdVar8 = pdVar9 + sVar6;
    pdVar11 = (this->scaled_rhs_)._M_data;
    do {
      *pdVar11 = *pdVar9 * *pdVar11;
      pdVar11 = pdVar11 + 1;
      pdVar9 = pdVar9 + 1;
    } while (pdVar9 < pdVar8);
  }
  return;
}

Assistant:

void Model::ScaleModel(const Control& control) {
    flipped_vars_.clear();
    for (Int j = 0; j < num_var_; j++) {
        if (std::isfinite(scaled_ubuser_[j]) && std::isinf(scaled_lbuser_[j])) {
            scaled_lbuser_[j] = -scaled_ubuser_[j];
            scaled_ubuser_[j] = INFINITY;
            ScaleColumn(A_, j, -1.0);
            scaled_obj_[j] *= -1.0;
            flipped_vars_.push_back(j);
        }
    }
    colscale_.resize(0);
    rowscale_.resize(0);

    // Choose scaling method.
    if (control.scale() >= 1)
        EquilibrateMatrix();

    // Apply scaling to vectors.
    if (colscale_.size() > 0) {
        assert((Int)colscale_.size() == num_var_);
        scaled_obj_ *= colscale_;
        scaled_lbuser_ /= colscale_;
        scaled_ubuser_ /= colscale_;
    }
    if (rowscale_.size() > 0) {
        assert((Int)rowscale_.size() == num_constr_);
        scaled_rhs_ *= rowscale_;
    }
}